

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::SendRTCPData(RTPSession *this,void *data,size_t len)

{
  int local_3c;
  undefined8 uStack_38;
  int status;
  size_t sendLen;
  void *pSendData;
  size_t len_local;
  void *data_local;
  RTPSession *this_local;
  
  pSendData = (void *)len;
  len_local = (size_t)data;
  data_local = this;
  if ((this->m_changeOutgoingData & 1U) == 0) {
    this_local._4_4_ =
         (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xf])
                   (this->rtptrans,data,len);
  }
  else {
    sendLen = 0;
    uStack_38 = 0;
    local_3c = (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x15])
                         (this,data,len,0,&sendLen,&stack0xffffffffffffffc8);
    this_local._4_4_ = local_3c;
    if (-1 < local_3c) {
      if (sendLen != 0) {
        local_3c = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xf])
                             (this->rtptrans,sendLen,uStack_38);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x16])(this,sendLen,uStack_38,0);
      }
      this_local._4_4_ = local_3c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SendRTCPData(const void *data, size_t len)
{
	if (!m_changeOutgoingData)
		return rtptrans->SendRTCPData(data, len);

	void *pSendData = 0;
	size_t sendLen = 0;
	int status = 0;

	status = OnChangeRTPOrRTCPData(data, len, false, &pSendData, &sendLen);
	if (status < 0)
		return status;

	if (pSendData)
	{
		status = rtptrans->SendRTCPData(pSendData, sendLen);
		OnSentRTPOrRTCPData(pSendData, sendLen, false);
	}

	return status;
}